

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O2

void write_cb(Fl_Widget *param_1,void *param_2)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int *piVar4;
  char cname [2048];
  char hname [2048];
  
  if ((filename == (char *)0x0) && (save_cb((Fl_Widget *)0x0,(void *)0x0), filename == (char *)0x0))
  {
    return;
  }
  pcVar2 = fl_filename_name(filename);
  fl_strlcpy(i18n_program,pcVar2,0x800);
  fl_filename_setext(i18n_program,0x800,"");
  pcVar2 = code_file_name;
  if ((*code_file_name == '.') && (pcVar3 = strchr(code_file_name,0x2f), pcVar3 == (char *)0x0)) {
    pcVar2 = fl_filename_name(filename);
    fl_strlcpy(cname,pcVar2,0x800);
    fl_filename_setext(cname,0x800,code_file_name);
  }
  else {
    fl_strlcpy(cname,pcVar2,0x800);
  }
  pcVar2 = header_file_name;
  if ((*header_file_name == '.') && (pcVar3 = strchr(header_file_name,0x2f), pcVar3 == (char *)0x0))
  {
    pcVar2 = fl_filename_name(filename);
    fl_strlcpy(hname,pcVar2,0x800);
    fl_filename_setext(hname,0x800,header_file_name);
  }
  else {
    fl_strlcpy(hname,pcVar2,0x800);
  }
  if (batch_mode == 0) {
    goto_source_dir();
  }
  iVar1 = write_code(cname,hname);
  if (batch_mode == 0) {
    leave_source_dir();
  }
  fl_strlcat(cname," and ",0x800);
  fl_strlcat(cname,hname,0x800);
  __stream = _stderr;
  if (batch_mode == 0) {
    if (iVar1 == 0) {
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      fl_message("Can\'t write %s: %s",cname,pcVar2);
    }
    else if ((completion_button->super_Fl_Light_Button).super_Fl_Button.value_ != '\0') {
      fl_message("Wrote %s",cname);
    }
  }
  else if (iVar1 == 0) {
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    fprintf(__stream,"%s : %s\n",cname,pcVar2);
    exit(1);
  }
  return;
}

Assistant:

void write_cb(Fl_Widget *, void *) {
  if (!filename) {
    save_cb(0,0);
    if (!filename) return;
  }
  char cname[FL_PATH_MAX];
  char hname[FL_PATH_MAX];
  strlcpy(i18n_program, fl_filename_name(filename), sizeof(i18n_program));
  fl_filename_setext(i18n_program, sizeof(i18n_program), "");
  if (*code_file_name == '.' && strchr(code_file_name, '/') == NULL) {
    strlcpy(cname, fl_filename_name(filename), sizeof(cname));
    fl_filename_setext(cname, sizeof(cname), code_file_name);
  } else {
    strlcpy(cname, code_file_name, sizeof(hname));
  }
  if (*header_file_name == '.' && strchr(header_file_name, '/') == NULL) {
    strlcpy(hname, fl_filename_name(filename), sizeof(hname));
    fl_filename_setext(hname, sizeof(hname), header_file_name);
  } else {
    strlcpy(hname, header_file_name, sizeof(hname));
  }
  if (!batch_mode) goto_source_dir();
  int x = write_code(cname,hname);
  if (!batch_mode) leave_source_dir();
  strlcat(cname, " and ", sizeof(cname));
  strlcat(cname, hname, sizeof(cname));
  if (batch_mode) {
    if (!x) {fprintf(stderr,"%s : %s\n",cname,strerror(errno)); exit(1);}
  } else {
    if (!x) {
      fl_message("Can't write %s: %s", cname, strerror(errno));
    } else if (completion_button->value()) {
      fl_message("Wrote %s", cname);
    }
  }
}